

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_MultiFab.cpp
# Opt level: O1

void __thiscall amrex::MultiFab::initVal(MultiFab *this)

{
  int *piVar1;
  MFIter mfi;
  MFIter MStack_78;
  
  MFIter::MFIter(&MStack_78,(FabArrayBase *)this,'\0');
  if (MStack_78.currentIndex < MStack_78.endIndex) {
    do {
      piVar1 = &MStack_78.currentIndex;
      if (MStack_78.local_index_map != (Vector<int,_std::allocator<int>_> *)0x0) {
        piVar1 = ((MStack_78.local_index_map)->super_vector<int,_std::allocator<int>_>).
                 super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                 _M_start + MStack_78.currentIndex;
      }
      FArrayBox::initVal((this->super_FabArray<amrex::FArrayBox>).m_fabs_v.
                         super__Vector_base<amrex::FArrayBox_*,_std::allocator<amrex::FArrayBox_*>_>
                         ._M_impl.super__Vector_impl_data._M_start[*piVar1]);
      MFIter::operator++(&MStack_78);
    } while (MStack_78.currentIndex < MStack_78.endIndex);
  }
  MFIter::~MFIter(&MStack_78);
  return;
}

Assistant:

void
MultiFab::initVal ()
{
#ifdef AMREX_USE_OMP
#pragma omp parallel if (Gpu::notInLaunchRegion())
#endif
    for (MFIter mfi(*this); mfi.isValid(); ++mfi)
    {
        FArrayBox& fab = (*this)[mfi];
        fab.initVal();
    }
}